

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDEdge::MarkedVertexCount(ON_SubDEdge *this)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  
  lVar2 = 0;
  uVar3 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    if (this->m_vertex[lVar2] != (ON_SubDVertex *)0x0) {
      bVar1 = ON_ComponentStatus::RuntimeMark
                        (&(this->m_vertex[lVar2]->super_ON_SubDComponentBase).m_status);
      uVar3 = uVar3 + bVar1;
    }
    lVar2 = 1;
    bVar1 = false;
  } while (bVar4);
  return uVar3;
}

Assistant:

unsigned int ON_SubDEdge::MarkedVertexCount() const
{
  unsigned int mark_count = 0;
  for (unsigned evi = 0; evi < 2; ++evi)
  {
    const ON_SubDVertex* v = m_vertex[evi];
    if (nullptr != v && v->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}